

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::handle_hb_timeout(raft_server *this,int32 srv_id)

{
  uint uVar1;
  element_type *peVar2;
  element_type *peVar3;
  ulong uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  context *pcVar6;
  bool bVar7;
  int iVar8;
  uint64_t uVar9;
  _Hash_node_base *p_Var10;
  long lVar11;
  ulong uVar12;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  Param param;
  uint64_t last_log_idx;
  unique_lock<std::recursive_mutex> guard;
  undefined1 local_a8 [32];
  undefined1 local_88 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [16];
  ptr<peer> local_50;
  Type local_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  local_38._M_allocated_capacity = (size_type)&this->lock_;
  local_38._M_local_buf[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_38);
  local_38._M_local_buf[8] = true;
  check_srv_to_leave_timeout(this);
  if (((this->write_paused_)._M_base._M_i & 1U) != 0) {
    bVar7 = timer_helper::timeout(&this->reelection_timer_);
    if (bVar7) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) &&
         (iVar8 = (**(code **)(*(long *)peVar2 + 0x38))(), 3 < iVar8)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar9 = timer_helper::get_us(&this->reelection_timer_);
        msg_if_given_abi_cxx11_
                  ((string *)local_a8,"resign by timeout, %lu us elapsed, resign now",uVar9);
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x40,local_a8);
        if ((Param *)local_a8._0_8_ != (Param *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
      }
      LOCK();
      (this->leader_).super___atomic_base<int>._M_i = -1;
      UNLOCK();
      become_follower(this);
      LOCK();
      (this->hb_alive_)._M_base._M_i = false;
      UNLOCK();
      goto LAB_001ea813;
    }
  }
  if (((((this->srv_to_join_snp_retry_required_)._M_base._M_i & 1U) == 0) ||
      (peVar3 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr, peVar3 == (element_type *)0x0)) ||
     (((peVar3->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->id_ != srv_id)) {
    uVar4 = (this->peers_)._M_h._M_bucket_count;
    uVar12 = (ulong)(long)srv_id % uVar4;
    p_Var13 = (this->peers_)._M_h._M_buckets[uVar12];
    p_Var14 = (__node_base_ptr)0x0;
    if ((p_Var13 != (__node_base_ptr)0x0) &&
       (p_Var10 = p_Var13->_M_nxt, p_Var14 = p_Var13, *(int *)&p_Var13->_M_nxt[1]._M_nxt != srv_id))
    {
      while (p_Var13 = p_Var10, p_Var10 = p_Var13->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
        p_Var14 = (__node_base_ptr)0x0;
        if (((ulong)(long)*(int *)&p_Var10[1]._M_nxt % uVar4 != uVar12) ||
           (p_Var14 = p_Var13, *(int *)&p_Var10[1]._M_nxt == srv_id)) goto LAB_001ea1cc;
      }
      p_Var14 = (__node_base_ptr)0x0;
    }
LAB_001ea1cc:
    if (p_Var14 == (__node_base_ptr)0x0) {
      p_Var10 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var10 = p_Var14->_M_nxt;
    }
    if (p_Var10 == (_Hash_node_base *)0x0) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) &&
         (iVar8 = (**(code **)(*(long *)peVar2 + 0x38))(), 1 < iVar8)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_a8,"heartbeat handler error: server %d not exist",srv_id);
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x69,local_a8);
        if ((Param *)local_a8._0_8_ != (Param *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
      }
      goto LAB_001ea813;
    }
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10[2]._M_nxt;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10[3]._M_nxt;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if ((p_Var5[0x1d]._M_weak_count & 1) != 0) {
      LOCK();
      *(int *)&p_Var5[0x1e]._vptr__Sp_counted_base =
           *(int *)&p_Var5[0x1e]._vptr__Sp_counted_base + 1;
      UNLOCK();
      uVar1 = *(uint *)&p_Var5[0x1e]._vptr__Sp_counted_base;
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) &&
         (iVar8 = (**(code **)(*(long *)peVar2 + 0x38))(), 3 < iVar8)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_a8,"peer %d is not responding for %d HBs since leave request",
                   (ulong)*(uint *)&((_Hash_node_base *)p_Var5->_vptr__Sp_counted_base)->_M_nxt,
                   (ulong)uVar1);
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x76,local_a8);
        if ((Param *)local_a8._0_8_ != (Param *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
      }
      if (DAT_0023b1ac <= (int)uVar1) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) &&
           (iVar8 = (**(code **)(*(long *)peVar2 + 0x38))(), 1 < iVar8)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_a8,"force remove peer %d",
                     (ulong)*(uint *)&((_Hash_node_base *)p_Var5->_vptr__Sp_counted_base)->_M_nxt);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x7a,local_a8);
          if ((Param *)local_a8._0_8_ != (Param *)(local_a8 + 0x10)) {
            operator_delete((void *)local_a8._0_8_);
          }
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_50.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)p_Var5;
        local_50.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             this_00;
        handle_join_leave_rpc_err(this,leave_cluster_request,&local_50);
        if (local_50.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        goto joined_r0x001ea809;
      }
    }
    local_88._0_4_ = this->id_;
    local_88._4_4_ = (this->leader_).super___atomic_base<int>._M_i;
    local_88._8_4_ = *(undefined4 *)&((_Hash_node_base *)p_Var5->_vptr__Sp_counted_base)->_M_nxt;
    local_88._16_8_ = (element_type *)0x0;
    lVar11 = (**(code **)(*(long *)(this->log_store_).
                                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 0x10))();
    local_70._M_allocated_capacity = lVar11 - 1;
    local_88._16_8_ = &local_70;
    pcVar6 = (this->ctx_)._M_t.
             super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
             super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
             super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
    if ((pcVar6->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
      local_3c = HeartBeat;
      local_a8._0_8_ = local_88;
      (*(pcVar6->cb_func_).func._M_invoker)
                ((_Any_data *)&pcVar6->cb_func_,&local_3c,(Param **)local_a8);
    }
    if (((this->stopping_)._M_base._M_i & 1U) == 0) {
      bVar7 = check_leadership_validity(this);
      if (bVar7) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) &&
           (iVar8 = (**(code **)(*(long *)peVar2 + 0x38))(), 4 < iVar8)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_a8,"heartbeat timeout for %d",
                     (ulong)*(uint *)&((_Hash_node_base *)p_Var5->_vptr__Sp_counted_base)->_M_nxt);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x8e,local_a8);
          if ((Param *)local_a8._0_8_ != (Param *)(local_a8 + 0x10)) {
            operator_delete((void *)local_a8._0_8_);
          }
        }
        if ((this->role_)._M_i == leader) {
          update_target_priority(this);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          local_60._0_8_ = p_Var5;
          local_60._8_8_ = this_00;
          request_append_entries(this,(ptr<peer> *)local_60);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
          }
          iVar8 = pthread_mutex_lock((pthread_mutex_t *)&p_Var5[0xd]._M_use_count);
          if (iVar8 != 0) {
            std::__throw_system_error(iVar8);
          }
          if (*(undefined1 *)((long)&p_Var5[8]._M_use_count + 2) == '\x01') {
            schedule_task(this,(ptr<delayed_task> *)(p_Var5 + 9),p_Var5[5]._M_use_count);
          }
          else {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((peVar2 != (element_type *)0x0) &&
               (iVar8 = (**(code **)(*(long *)peVar2 + 0x38))(), 4 < iVar8)) {
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)local_a8,"heartbeat is disabled for peer %d",
                         (ulong)*(uint *)&((_Hash_node_base *)p_Var5->_vptr__Sp_counted_base)->
                                          _M_nxt);
              (**(code **)(*(long *)peVar2 + 0x40))
                        (peVar2,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                         ,"handle_hb_timeout",0x98,local_a8);
              if ((Param *)local_a8._0_8_ != (Param *)(local_a8 + 0x10)) {
                operator_delete((void *)local_a8._0_8_);
              }
            }
          }
          pthread_mutex_unlock((pthread_mutex_t *)&p_Var5[0xd]._M_use_count);
        }
        else {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar2 != (element_type *)0x0) &&
             (iVar8 = (**(code **)(*(long *)peVar2 + 0x38))(), 2 < iVar8)) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_a8,
                       "Receive a heartbeat event for %d while no longer as a leader",
                       (ulong)*(uint *)&((_Hash_node_base *)p_Var5->_vptr__Sp_counted_base)->_M_nxt)
            ;
            (**(code **)(*(long *)peVar2 + 0x40))
                      (peVar2,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                       ,"handle_hb_timeout",0x9d,local_a8);
            goto LAB_001ea3f6;
          }
        }
      }
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) &&
         (iVar8 = (**(code **)(*(long *)peVar2 + 0x38))(), 2 < iVar8)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_a8,"Triggered HB timer but server is shutting down")
        ;
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x88,local_a8);
LAB_001ea3f6:
        if ((Param *)local_a8._0_8_ != (Param *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
      }
    }
joined_r0x001ea809:
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) &&
       (iVar8 = (**(code **)(*(long *)peVar2 + 0x38))(), 3 < iVar8)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)local_a8,"retrying snapshot read for server %d",srv_id);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                 ,"handle_hb_timeout",0x4c,local_a8);
      if ((Param *)local_a8._0_8_ != (Param *)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_);
      }
    }
    bVar7 = peer::need_to_reconnect
                      ((this->srv_to_join_).
                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (bVar7) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) &&
         (iVar8 = (**(code **)(*(long *)peVar2 + 0x38))(), 3 < iVar8)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_a8,"rpc client for %d needs reconnection",srv_id);
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x4e,local_a8);
        if ((Param *)local_a8._0_8_ != (Param *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
      }
      context::get_params((context *)local_88);
      uVar9 = timer_helper::get_us
                        (&((this->srv_to_join_).
                           super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          last_resp_timer_);
      if ((ulong)((long)DAT_0023b1a0 * (long)*(int *)(CONCAT44(local_88._4_4_,local_88._0_4_) + 8))
          <= uVar9 / 1000) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) &&
           (iVar8 = (**(code **)(*(long *)peVar2 + 0x38))(), 3 < iVar8)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_a8,"response timeout: %lu ms, will not retry",uVar9 / 1000);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x54,local_a8);
          if ((Param *)local_a8._0_8_ != (Param *)(local_a8 + 0x10)) {
            operator_delete((void *)local_a8._0_8_);
          }
        }
        clear_snapshot_sync_ctx
                  (this,(this->srv_to_join_).
                        super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT44(local_88._12_4_,local_88._8_4_);
        goto joined_r0x001ea809;
      }
      srv_config::serialize((srv_config *)local_a8);
      srv_config::deserialize((srv_config *)&local_70,(buffer *)local_a8._0_8_);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
      bVar7 = peer::recreate_rpc((this->srv_to_join_).
                                 super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                 ,(ptr<srv_config> *)&local_70,
                                 (this->ctx_)._M_t.
                                 super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                                 .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl);
      if (bVar7) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_88._12_4_,local_88._8_4_)
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(local_88._12_4_,local_88._8_4_));
        }
      }
      else {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) &&
           (iVar8 = (**(code **)(*(long *)peVar2 + 0x38))(), 2 < iVar8)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_((string *)local_a8,"reconnection failed, will not retry");
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x5e,local_a8);
          if ((Param *)local_a8._0_8_ != (Param *)(local_a8 + 0x10)) {
            operator_delete((void *)local_a8._0_8_);
          }
        }
        clear_snapshot_sync_ctx
                  (this,(this->srv_to_join_).
                        super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_88._12_4_,local_88._8_4_)
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(local_88._12_4_,local_88._8_4_));
        }
        if (!bVar7) goto LAB_001ea813;
      }
    }
    sync_log_to_new_srv(this,0);
  }
LAB_001ea813:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_38);
  return;
}

Assistant:

void raft_server::handle_hb_timeout(int32 srv_id) {
    recur_lock(lock_);

    check_srv_to_leave_timeout();

    if (write_paused_ && reelection_timer_.timeout()) {
        p_in("resign by timeout, %" PRIu64 " us elapsed, resign now",
             reelection_timer_.get_us());
        leader_ = -1;
        become_follower();

        // Clear this flag to avoid pre-vote rejection.
        hb_alive_ = false;
        return;
    }

    if ( srv_to_join_snp_retry_required_ &&
         srv_to_join_ &&
         srv_to_join_->get_id() == srv_id ) {
        p_in("retrying snapshot read for server %d", srv_id);
        if (srv_to_join_->need_to_reconnect()) {
            p_in("rpc client for %d needs reconnection", srv_id);

            ptr<raft_params> params = ctx_->get_params();
            uint64_t resp_timer_ms = srv_to_join_->get_resp_timer_us() / 1000;
            if ( resp_timer_ms >= (uint64_t)params->heart_beat_interval_ *
                                  raft_server::raft_limits_.response_limit_ ) {
                p_in("response timeout: %" PRIu64 " ms, will not retry", resp_timer_ms);
                clear_snapshot_sync_ctx(*srv_to_join_);
                return;
            }

            ptr<srv_config> s_config =
                srv_config::deserialize( *srv_to_join_->get_config().serialize() );
            bool succ = srv_to_join_->recreate_rpc(s_config, *ctx_);
            if (!succ) {
                // Reconnection failed.
                p_wn("reconnection failed, will not retry");
                clear_snapshot_sync_ctx(*srv_to_join_);
                return;
            }
        }
        sync_log_to_new_srv(0);
        return;
    }

    auto pit = peers_.find(srv_id);
    if (pit == peers_.end()) {
        p_er("heartbeat handler error: server %d not exist", srv_id);
        return;
    }

    // To avoid freeing this pointer in the middle of this function.
    ptr<peer> p = pit->second;

    if (p->is_leave_flag_set()) {
        // Leave request has been sent but not removed yet,
        // increase the counter.
        p->inc_hb_cnt_since_leave();
        int32 cur_cnt = p->get_hb_cnt_since_leave();
        p_in("peer %d is not responding for %d HBs since leave request",
             p->get_id(), cur_cnt);

        if (cur_cnt >= raft_server::raft_limits_.leave_limit_) {
            // Force remove the server.
            p_er("force remove peer %d", p->get_id());
            handle_join_leave_rpc_err(msg_type::leave_cluster_request, p);
            return;
        }
    }

    cb_func::Param param(id_, leader_, p->get_id());
    uint64_t last_log_idx = log_store_->next_slot() - 1;
    param.ctx = &last_log_idx;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::HeartBeat, &param);
    (void)rc;

    // Server is being shut down.
    if (stopping_) {
        p_wn("Triggered HB timer but server is shutting down");
        return;
    }

    if (!check_leadership_validity()) return;

    p_db("heartbeat timeout for %d", p->get_id());
    if (role_ == srv_role::leader) {
        update_target_priority();
        request_append_entries(p);
        {
            std::lock_guard<std::mutex> guard(p->get_lock());
            if (p->is_hb_enabled()) {
                // Schedule another heartbeat if heartbeat is still enabled
                schedule_task(p->get_hb_task(), p->get_current_hb_interval());
            } else {
                p_db("heartbeat is disabled for peer %d", p->get_id());
            }
        }
    } else {
        p_wn("Receive a heartbeat event for %d "
             "while no longer as a leader", p->get_id());
    }
}